

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_decode_scanline(spng_ctx *ctx,void *out,size_t len)

{
  size_t __n;
  uchar *__s2;
  byte *pbVar1;
  spng_subimage *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint8_t uVar5;
  ushort uVar6;
  spng_format sVar7;
  uint uVar8;
  uint32_t uVar9;
  uint16_t *puVar10;
  undefined3 uVar11;
  undefined3 uVar12;
  undefined7 uVar13;
  undefined3 uVar14;
  undefined1 auVar15 [16];
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  byte bVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  int iVar24;
  uint uVar25;
  size_t i;
  size_t sVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ushort *puVar37;
  ulong uVar38;
  byte *pbVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  byte *pbVar44;
  uint bit_depth;
  uint16_t *px;
  byte bVar45;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  undefined1 auVar46 [16];
  short sVar51;
  short sVar52;
  short sVar53;
  undefined1 auVar50 [16];
  undefined4 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  char cVar58;
  short sVar59;
  char cVar67;
  ushort uVar60;
  undefined1 auVar63 [14];
  undefined4 uVar61;
  char cVar68;
  short sVar69;
  char cVar71;
  ushort uVar70;
  char cVar72;
  byte bVar73;
  short sVar74;
  char cVar76;
  byte bVar77;
  ushort uVar75;
  char cVar78;
  byte bVar79;
  short sVar80;
  char cVar82;
  byte bVar83;
  ushort uVar81;
  char cVar84;
  byte bVar85;
  short sVar86;
  char cVar88;
  byte bVar89;
  ushort uVar87;
  char cVar90;
  byte bVar91;
  char cVar93;
  byte bVar94;
  ushort uVar92;
  char cVar95;
  byte bVar96;
  char cVar98;
  byte bVar99;
  ushort uVar97;
  char cVar100;
  byte bVar101;
  char cVar103;
  byte bVar104;
  ushort uVar102;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar105 [16];
  short sVar106;
  ushort uVar107;
  short sVar109;
  ushort uVar110;
  short sVar111;
  ushort uVar112;
  short sVar113;
  ushort uVar114;
  short sVar115;
  ushort uVar116;
  short sVar117;
  ushort uVar118;
  short sVar119;
  ushort uVar120;
  short sVar121;
  ushort uVar122;
  undefined1 auVar108 [16];
  short sVar123;
  ushort uVar124;
  short sVar126;
  ushort uVar127;
  short sVar128;
  ushort uVar129;
  short sVar130;
  ushort uVar131;
  short sVar132;
  ushort uVar133;
  short sVar134;
  ushort uVar135;
  short sVar136;
  ushort uVar137;
  undefined1 auVar125 [16];
  short sVar138;
  ushort uVar139;
  ushort uVar140;
  ushort uVar141;
  ushort uVar142;
  ushort uVar143;
  ushort uVar144;
  ushort uVar145;
  ushort uVar146;
  ushort uVar147;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  byte *local_78;
  byte *local_60;
  ulong local_58;
  undefined6 uVar62;
  undefined1 auVar66 [16];
  
  if (out == (void *)0x0 || ctx == (spng_ctx *)0x0) {
    return 1;
  }
  if (SPNG_STATE_DECODE_INIT < ctx->state) {
    return 0x4b;
  }
  bVar19 = (ctx->ihdr).bit_depth;
  uVar6 = *(ushort *)&ctx->decode_flags;
  iVar24 = (ctx->row_info).pass;
  sVar7 = ctx->fmt;
  uVar35 = (uint)bVar19;
  bit_depth = 8;
  if ((uVar6 & 8) == 0) {
    bit_depth = uVar35;
  }
  lVar43 = 8;
  if (sVar7 != SPNG_FMT_RGBA16) {
    lVar43 = (ulong)(sVar7 != SPNG_FMT_RGB8) + 3;
  }
  if (len < ctx->subimage[iVar24].out_width) {
    return 0x42;
  }
  puVar10 = ctx->gamma_lut;
  local_78 = ctx->scanline;
  psVar2 = ctx->subimage + iVar24;
  sVar26 = psVar2->scanline_width;
  uVar8 = psVar2->width;
  uVar28 = (ulong)uVar8;
  uVar9 = (ctx->row_info).scanline_idx;
  if ((uVar9 == psVar2->height - 1) && (iVar24 == ctx->last_pass)) {
    iVar24 = read_scanline_bytes(ctx,local_78,sVar26 - 1);
    if (iVar24 != 0) goto LAB_00102f59;
    bVar32 = 0;
  }
  else {
    iVar24 = read_scanline_bytes(ctx,local_78,sVar26);
    if (iVar24 != 0) goto LAB_00102f59;
    bVar32 = ctx->scanline[sVar26 - 1];
    if (4 < bVar32) {
      iVar24 = 0x41;
      goto LAB_00102f59;
    }
  }
  if ((uVar9 == 0) && (1 < (ctx->row_info).filter)) {
    memset(ctx->prev_scanline,0,sVar26);
  }
  if ((ctx->ihdr).bit_depth == '\x10') {
    pbVar44 = ctx->scanline;
    if (ctx->fmt != SPNG_FMT_RAW) {
      for (uVar30 = 0; sVar26 - 1 >> 1 != uVar30; uVar30 = uVar30 + 1) {
        puVar37 = (ushort *)(pbVar44 + uVar30 * 2);
        *puVar37 = *puVar37 << 8 | *puVar37 >> 8;
      }
    }
  }
  else {
    pbVar44 = ctx->scanline;
  }
  iVar24 = 0x50;
  if (((sVar26 == 0) || (pbVar39 = ctx->prev_scanline, pbVar39 == (byte *)0x0)) ||
     (pbVar44 == (byte *)0x0)) {
LAB_00102f59:
    ctx->state = SPNG_STATE_INVALID;
    return iVar24;
  }
  uVar5 = (ctx->row_info).filter;
  __n = sVar26 - 1;
  if (uVar5 != '\0') {
    if (uVar5 == '\x02') {
      for (sVar26 = 0; __n != sVar26; sVar26 = sVar26 + 1) {
        pbVar44[sVar26] = pbVar44[sVar26] + pbVar39[sVar26];
      }
    }
    else {
      uVar30 = (ulong)ctx->bytes_per_pixel;
      if (uVar30 == 3) {
        if (uVar5 == '\x01') {
          bVar45 = 0;
          bVar47 = 0;
          bVar48 = 0;
          for (sVar26 = __n; 3 < sVar26; sVar26 = sVar26 - 3) {
            uVar54 = *(undefined4 *)pbVar44;
            bVar45 = bVar45 + (char)uVar54;
            bVar47 = bVar47 + (char)((uint)uVar54 >> 8);
            bVar48 = bVar48 + (char)((uint)uVar54 >> 0x10);
            *pbVar44 = bVar45;
            pbVar44[1] = bVar47;
            pbVar44[2] = bVar48;
            pbVar44 = pbVar44 + 3;
          }
          if (sVar26 != 0) {
            uVar11 = *(undefined3 *)pbVar44;
            uVar33 = (uint)CONCAT12(bVar48 + (char)((uint3)uVar11 >> 0x10),
                                    CONCAT11(bVar47 + (char)((uint3)uVar11 >> 8),
                                             bVar45 + (char)uVar11));
LAB_0010296c:
            *(short *)pbVar44 = (short)uVar33;
            pbVar44[2] = (byte)(uVar33 >> 0x10);
          }
        }
        else if (uVar5 == '\x03') {
          bVar45 = 0;
          bVar47 = 0;
          bVar48 = 0;
          bVar49 = 0;
          bVar73 = 0;
          bVar77 = 0;
          bVar79 = 0;
          bVar83 = 0;
          bVar85 = 0;
          bVar89 = 0;
          bVar91 = 0;
          bVar94 = 0;
          bVar96 = 0;
          bVar99 = 0;
          bVar101 = 0;
          bVar104 = 0;
          for (sVar26 = __n; 3 < sVar26; sVar26 = sVar26 - 3) {
            uVar54 = *(undefined4 *)pbVar44;
            cVar58 = pavgb(bVar45,*pbVar39);
            cVar67 = pavgb(bVar47,pbVar39[1]);
            cVar68 = pavgb(bVar48,pbVar39[2]);
            cVar71 = pavgb(bVar49,pbVar39[3]);
            cVar72 = pavgb(bVar73,0);
            cVar76 = pavgb(bVar77,0);
            cVar78 = pavgb(bVar79,0);
            cVar82 = pavgb(bVar83,0);
            cVar84 = pavgb(bVar85,0);
            cVar88 = pavgb(bVar89,0);
            cVar90 = pavgb(bVar91,0);
            cVar93 = pavgb(bVar94,0);
            cVar95 = pavgb(bVar96,0);
            cVar98 = pavgb(bVar99,0);
            cVar100 = pavgb(bVar101,0);
            cVar103 = pavgb(bVar104,0);
            bVar73 = cVar72 - (bVar73 & 1);
            bVar77 = cVar76 - (bVar77 & 1);
            bVar79 = cVar78 - (bVar79 & 1);
            bVar83 = cVar82 - (bVar83 & 1);
            bVar85 = cVar84 - (bVar85 & 1);
            bVar89 = cVar88 - (bVar89 & 1);
            bVar91 = cVar90 - (bVar91 & 1);
            bVar94 = cVar93 - (bVar94 & 1);
            bVar96 = cVar95 - (bVar96 & 1);
            bVar99 = cVar98 - (bVar99 & 1);
            bVar101 = cVar100 - (bVar101 & 1);
            bVar104 = cVar103 - (bVar104 & 1);
            bVar45 = (cVar58 - ((bVar45 ^ *pbVar39) & 1)) + (char)uVar54;
            bVar47 = (cVar67 - ((bVar47 ^ pbVar39[1]) & 1)) + (char)((uint)uVar54 >> 8);
            bVar48 = (cVar68 - ((bVar48 ^ pbVar39[2]) & 1)) + (char)((uint)uVar54 >> 0x10);
            bVar49 = (cVar71 - ((bVar49 ^ pbVar39[3]) & 1)) + (char)((uint)uVar54 >> 0x18);
            *pbVar44 = bVar45;
            pbVar44[1] = bVar47;
            pbVar44[2] = bVar48;
            pbVar39 = pbVar39 + 3;
            pbVar44 = pbVar44 + 3;
          }
          if (sVar26 != 0) {
            uVar11 = *(undefined3 *)pbVar44;
            cVar58 = pavgb(bVar45,*pbVar39);
            cVar67 = pavgb(bVar47,pbVar39[1]);
            cVar68 = pavgb(bVar48,pbVar39[2]);
            pavgb(bVar49,0);
            pavgb(bVar73,0);
            pavgb(bVar77,0);
            pavgb(bVar79,0);
            pavgb(bVar83,0);
            pavgb(bVar85,0);
            pavgb(bVar89,0);
            pavgb(bVar91,0);
            pavgb(bVar94,0);
            pavgb(bVar96,0);
            pavgb(bVar99,0);
            pavgb(bVar101,0);
            pavgb(bVar104,0);
            uVar33 = (uint)CONCAT12((cVar68 + (char)((uint3)uVar11 >> 0x10)) -
                                    ((bVar48 ^ pbVar39[2]) & 1),
                                    CONCAT11((cVar67 + (char)((uint3)uVar11 >> 8)) -
                                             ((bVar47 ^ pbVar39[1]) & 1),
                                             (cVar58 + (char)uVar11) - ((bVar45 ^ *pbVar39) & 1)));
            goto LAB_0010296c;
          }
        }
        else {
          iVar24 = 0x41;
          if (uVar5 != '\x04') goto LAB_00102f59;
          auVar46 = (undefined1  [16])0x0;
          sVar26 = __n;
          auVar65 = (undefined1  [16])0x0;
          while( true ) {
            sVar115 = auVar65._0_2_;
            sVar59 = auVar46._0_2_ - sVar115;
            sVar117 = auVar65._2_2_;
            sVar69 = auVar46._2_2_ - sVar117;
            sVar119 = auVar65._4_2_;
            sVar74 = auVar46._4_2_ - sVar119;
            sVar80 = auVar46._6_2_ - auVar65._6_2_;
            sVar121 = auVar65._8_2_;
            sVar86 = auVar46._8_2_ - sVar121;
            sVar51 = auVar65._10_2_;
            sVar106 = auVar46._10_2_ - sVar51;
            sVar52 = auVar65._12_2_;
            sVar109 = auVar46._12_2_ - sVar52;
            sVar53 = auVar65._14_2_;
            sVar111 = auVar46._14_2_ - sVar53;
            if (sVar26 < 4) break;
            uVar54 = *(undefined4 *)pbVar39;
            bVar45 = (byte)((uint)uVar54 >> 0x18);
            uVar13 = CONCAT25((short)(((uint7)bVar45 << 0x30) >> 0x28),
                              CONCAT14((char)((uint)uVar54 >> 0x10),uVar54));
            uVar60 = (ushort)uVar54;
            uVar30 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar13 >> 0x20),uVar54) >> 0x18),
                                     CONCAT12((char)((uint)uVar54 >> 8),uVar60)) &
                     0xffffffff00ffffff;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = CONCAT62((int6)(uVar30 >> 0x10),uVar60) & 0xffffffffffff00ff;
            uVar54 = *(undefined4 *)pbVar44;
            sVar115 = (uVar60 & 0xff) - sVar115;
            sVar117 = (short)(uVar30 >> 0x10) - sVar117;
            sVar119 = (short)((uint7)uVar13 >> 0x20) - sVar119;
            sVar138 = (ushort)bVar45 - auVar65._6_2_;
            sVar113 = -sVar121;
            sVar123 = -sVar51;
            sVar126 = -sVar52;
            sVar128 = -sVar53;
            sVar130 = -sVar115;
            sVar132 = -sVar117;
            sVar134 = -sVar119;
            sVar136 = -sVar138;
            uVar107 = (ushort)(sVar130 < sVar115) * sVar115 | (ushort)(sVar130 >= sVar115) * sVar130
            ;
            uVar110 = (ushort)(sVar132 < sVar117) * sVar117 | (ushort)(sVar132 >= sVar117) * sVar132
            ;
            uVar112 = (ushort)(sVar134 < sVar119) * sVar119 | (ushort)(sVar134 >= sVar119) * sVar134
            ;
            uVar114 = (ushort)(sVar136 < sVar138) * sVar138 | (ushort)(sVar136 >= sVar138) * sVar136
            ;
            uVar116 = (ushort)(sVar121 < sVar113) * sVar113 | (ushort)(sVar121 >= sVar113) * sVar121
            ;
            uVar118 = (ushort)(sVar51 < sVar123) * sVar123 | (ushort)(sVar51 >= sVar123) * sVar51;
            uVar120 = (ushort)(sVar52 < sVar126) * sVar126 | (ushort)(sVar52 >= sVar126) * sVar52;
            uVar122 = (ushort)(sVar53 < sVar128) * sVar128 | (ushort)(sVar53 >= sVar128) * sVar53;
            sVar115 = sVar115 + sVar59;
            sVar117 = sVar117 + sVar69;
            sVar119 = sVar119 + sVar74;
            sVar138 = sVar138 + sVar80;
            sVar113 = sVar113 + sVar86;
            sVar123 = sVar123 + sVar106;
            sVar126 = sVar126 + sVar109;
            sVar128 = sVar128 + sVar111;
            sVar121 = -sVar59;
            sVar51 = -sVar69;
            sVar52 = -sVar74;
            sVar53 = -sVar80;
            sVar130 = -sVar86;
            sVar132 = -sVar106;
            sVar134 = -sVar109;
            sVar136 = -sVar111;
            uVar140 = (ushort)(sVar121 < sVar59) * sVar59 | (ushort)(sVar121 >= sVar59) * sVar121;
            uVar141 = (ushort)(sVar51 < sVar69) * sVar69 | (ushort)(sVar51 >= sVar69) * sVar51;
            uVar142 = (ushort)(sVar52 < sVar74) * sVar74 | (ushort)(sVar52 >= sVar74) * sVar52;
            uVar143 = (ushort)(sVar53 < sVar80) * sVar80 | (ushort)(sVar53 >= sVar80) * sVar53;
            uVar144 = (ushort)(sVar130 < sVar86) * sVar86 | (ushort)(sVar130 >= sVar86) * sVar130;
            uVar145 = (ushort)(sVar132 < sVar106) * sVar106 | (ushort)(sVar132 >= sVar106) * sVar132
            ;
            uVar146 = (ushort)(sVar134 < sVar109) * sVar109 | (ushort)(sVar134 >= sVar109) * sVar134
            ;
            uVar147 = (ushort)(sVar136 < sVar111) * sVar111 | (ushort)(sVar136 >= sVar111) * sVar136
            ;
            sVar121 = -sVar115;
            sVar51 = -sVar117;
            sVar52 = -sVar119;
            sVar53 = -sVar138;
            sVar59 = -sVar113;
            sVar69 = -sVar123;
            sVar74 = -sVar126;
            sVar80 = -sVar128;
            uVar60 = (ushort)(sVar121 < sVar115) * sVar115 | (ushort)(sVar121 >= sVar115) * sVar121;
            uVar70 = (ushort)(sVar51 < sVar117) * sVar117 | (ushort)(sVar51 >= sVar117) * sVar51;
            uVar75 = (ushort)(sVar52 < sVar119) * sVar119 | (ushort)(sVar52 >= sVar119) * sVar52;
            uVar81 = (ushort)(sVar53 < sVar138) * sVar138 | (ushort)(sVar53 >= sVar138) * sVar53;
            uVar87 = (ushort)(sVar59 < sVar113) * sVar113 | (ushort)(sVar59 >= sVar113) * sVar59;
            uVar92 = (ushort)(sVar69 < sVar123) * sVar123 | (ushort)(sVar69 >= sVar123) * sVar69;
            uVar97 = (ushort)(sVar74 < sVar126) * sVar126 | (ushort)(sVar74 >= sVar126) * sVar74;
            uVar102 = (ushort)(sVar80 < sVar128) * sVar128 | (ushort)(sVar80 >= sVar128) * sVar80;
            uVar124 = ((short)uVar140 < (short)uVar107) * uVar140 |
                      ((short)uVar140 >= (short)uVar107) * uVar107;
            uVar127 = ((short)uVar141 < (short)uVar110) * uVar141 |
                      ((short)uVar141 >= (short)uVar110) * uVar110;
            uVar129 = ((short)uVar142 < (short)uVar112) * uVar142 |
                      ((short)uVar142 >= (short)uVar112) * uVar112;
            uVar131 = ((short)uVar143 < (short)uVar114) * uVar143 |
                      ((short)uVar143 >= (short)uVar114) * uVar114;
            uVar133 = ((short)uVar144 < (short)uVar116) * uVar144 |
                      ((short)uVar144 >= (short)uVar116) * uVar116;
            uVar135 = ((short)uVar145 < (short)uVar118) * uVar145 |
                      ((short)uVar145 >= (short)uVar118) * uVar118;
            uVar137 = ((short)uVar146 < (short)uVar120) * uVar146 |
                      ((short)uVar146 >= (short)uVar120) * uVar120;
            uVar139 = ((short)uVar147 < (short)uVar122) * uVar147 |
                      ((short)uVar147 >= (short)uVar122) * uVar122;
            uVar60 = ((short)uVar60 < (short)uVar124) * uVar60 |
                     ((short)uVar60 >= (short)uVar124) * uVar124;
            uVar70 = ((short)uVar70 < (short)uVar127) * uVar70 |
                     ((short)uVar70 >= (short)uVar127) * uVar127;
            uVar75 = ((short)uVar75 < (short)uVar129) * uVar75 |
                     ((short)uVar75 >= (short)uVar129) * uVar129;
            uVar81 = ((short)uVar81 < (short)uVar131) * uVar81 |
                     ((short)uVar81 >= (short)uVar131) * uVar131;
            uVar87 = ((short)uVar87 < (short)uVar133) * uVar87 |
                     ((short)uVar87 >= (short)uVar133) * uVar133;
            uVar92 = ((short)uVar92 < (short)uVar135) * uVar92 |
                     ((short)uVar92 >= (short)uVar135) * uVar135;
            uVar97 = ((short)uVar97 < (short)uVar137) * uVar97 |
                     ((short)uVar97 >= (short)uVar137) * uVar137;
            uVar102 = ((short)uVar102 < (short)uVar139) * uVar102 |
                      ((short)uVar102 >= (short)uVar139) * uVar139;
            auVar105._0_2_ = -(ushort)(uVar107 == uVar60);
            auVar105._2_2_ = -(ushort)(uVar110 == uVar70);
            auVar105._4_2_ = -(ushort)(uVar112 == uVar75);
            auVar105._6_2_ = -(ushort)(uVar114 == uVar81);
            auVar105._8_2_ = -(ushort)(uVar116 == uVar87);
            auVar105._10_2_ = -(ushort)(uVar118 == uVar92);
            auVar105._12_2_ = -(ushort)(uVar120 == uVar97);
            auVar105._14_2_ = -(ushort)(uVar122 == uVar102);
            auVar125._0_2_ = -(ushort)(uVar60 == uVar140);
            auVar125._2_2_ = -(ushort)(uVar70 == uVar141);
            auVar125._4_2_ = -(ushort)(uVar75 == uVar142);
            auVar125._6_2_ = -(ushort)(uVar81 == uVar143);
            auVar125._8_2_ = -(ushort)(uVar87 == uVar144);
            auVar125._10_2_ = -(ushort)(uVar92 == uVar145);
            auVar125._12_2_ = -(ushort)(uVar97 == uVar146);
            auVar125._14_2_ = -(ushort)(uVar102 == uVar147);
            auVar65 = ~auVar105 & (~auVar125 & auVar65 | auVar57 & auVar125) | auVar46 & auVar105;
            cVar58 = auVar65[0] + (char)uVar54;
            sVar119 = CONCAT11(auVar65[1],cVar58);
            cVar67 = auVar65[2] + (char)((uint)uVar54 >> 8);
            uVar61 = CONCAT13(auVar65[3],CONCAT12(cVar67,sVar119));
            cVar68 = auVar65[4] + (char)((uint)uVar54 >> 0x10);
            auVar46._0_6_ = CONCAT15(auVar65[5],CONCAT14(cVar68,uVar61));
            auVar46[6] = auVar65[6] + (char)((uint)uVar54 >> 0x18);
            auVar46[7] = auVar65[7];
            auVar46[8] = auVar65[8];
            auVar46[9] = auVar65[9];
            auVar46[10] = auVar65[10];
            auVar46[0xb] = auVar65[0xb];
            auVar46[0xc] = auVar65[0xc];
            auVar46[0xd] = auVar65[0xd];
            auVar46[0xe] = auVar65[0xe];
            auVar46[0xf] = auVar65[0xf];
            sVar115 = (short)((uint)uVar61 >> 0x10);
            sVar117 = (short)((uint6)auVar46._0_6_ >> 0x20);
            *(ushort *)pbVar44 =
                 CONCAT11((0 < sVar115) * (sVar115 < 0x100) * cVar67 - (0xff < sVar115),
                          (0 < sVar119) * (sVar119 < 0x100) * cVar58 - (0xff < sVar119));
            pbVar44[2] = (0 < sVar117) * (sVar117 < 0x100) * cVar68 - (0xff < sVar117);
            pbVar39 = pbVar39 + 3;
            pbVar44 = pbVar44 + 3;
            sVar26 = sVar26 - 3;
            auVar65 = auVar57;
          }
          if (sVar26 != 0) {
            uVar11 = *(undefined3 *)pbVar39;
            bVar45 = (byte)((uint3)uVar11 >> 0x10);
            uVar14 = CONCAT21((short)(((uint5)bVar45 << 0x20) >> 0x18),(char)((uint3)uVar11 >> 8));
            uVar12 = *(undefined3 *)pbVar44;
            sVar115 = (ushort)(byte)uVar11 - sVar115;
            sVar117 = (short)uVar14 - sVar117;
            sVar119 = (ushort)bVar45 - sVar119;
            sVar80 = -sVar121;
            sVar113 = -sVar51;
            sVar123 = -sVar52;
            sVar126 = -sVar53;
            sVar128 = -sVar115;
            sVar130 = -sVar117;
            sVar132 = -sVar119;
            uVar60 = (ushort)(sVar128 < sVar115) * sVar115 | (ushort)(sVar128 >= sVar115) * sVar128;
            uVar70 = (ushort)(sVar130 < sVar117) * sVar117 | (ushort)(sVar130 >= sVar117) * sVar130;
            uVar75 = (ushort)(sVar132 < sVar119) * sVar119 | (ushort)(sVar132 >= sVar119) * sVar132;
            uVar81 = (ushort)(sVar121 < sVar80) * sVar80 | (ushort)(sVar121 >= sVar80) * sVar121;
            uVar87 = (ushort)(sVar51 < sVar113) * sVar113 | (ushort)(sVar51 >= sVar113) * sVar51;
            uVar92 = (ushort)(sVar52 < sVar123) * sVar123 | (ushort)(sVar52 >= sVar123) * sVar52;
            uVar97 = (ushort)(sVar53 < sVar126) * sVar126 | (ushort)(sVar53 >= sVar126) * sVar53;
            sVar115 = sVar115 + sVar59;
            sVar117 = sVar117 + sVar69;
            sVar119 = sVar119 + sVar74;
            sVar80 = sVar80 + sVar86;
            sVar113 = sVar113 + sVar106;
            sVar123 = sVar123 + sVar109;
            sVar126 = sVar126 + sVar111;
            sVar121 = -sVar59;
            sVar51 = -sVar69;
            sVar52 = -sVar74;
            sVar53 = -sVar86;
            sVar128 = -sVar106;
            sVar130 = -sVar109;
            sVar132 = -sVar111;
            uVar135 = (ushort)(sVar121 < sVar59) * sVar59 | (ushort)(sVar121 >= sVar59) * sVar121;
            uVar137 = (ushort)(sVar51 < sVar69) * sVar69 | (ushort)(sVar51 >= sVar69) * sVar51;
            uVar139 = (ushort)(sVar52 < sVar74) * sVar74 | (ushort)(sVar52 >= sVar74) * sVar52;
            uVar140 = (ushort)(sVar53 < sVar86) * sVar86 | (ushort)(sVar53 >= sVar86) * sVar53;
            uVar141 = (ushort)(sVar128 < sVar106) * sVar106 | (ushort)(sVar128 >= sVar106) * sVar128
            ;
            uVar142 = (ushort)(sVar130 < sVar109) * sVar109 | (ushort)(sVar130 >= sVar109) * sVar130
            ;
            uVar143 = (ushort)(sVar132 < sVar111) * sVar111 | (ushort)(sVar132 >= sVar111) * sVar132
            ;
            sVar121 = -sVar115;
            sVar51 = -sVar117;
            sVar52 = -sVar119;
            sVar53 = -sVar80;
            sVar59 = -sVar113;
            sVar69 = -sVar123;
            sVar74 = -sVar126;
            uVar120 = (ushort)(sVar121 < sVar115) * sVar115 | (ushort)(sVar121 >= sVar115) * sVar121
            ;
            uVar122 = (ushort)(sVar51 < sVar117) * sVar117 | (ushort)(sVar51 >= sVar117) * sVar51;
            uVar124 = (ushort)(sVar52 < sVar119) * sVar119 | (ushort)(sVar52 >= sVar119) * sVar52;
            uVar127 = (ushort)(sVar53 < sVar80) * sVar80 | (ushort)(sVar53 >= sVar80) * sVar53;
            uVar129 = (ushort)(sVar59 < sVar113) * sVar113 | (ushort)(sVar59 >= sVar113) * sVar59;
            uVar131 = (ushort)(sVar69 < sVar123) * sVar123 | (ushort)(sVar69 >= sVar123) * sVar69;
            uVar133 = (ushort)(sVar74 < sVar126) * sVar126 | (ushort)(sVar74 >= sVar126) * sVar74;
            uVar102 = ((short)uVar135 < (short)uVar60) * uVar135 |
                      ((short)uVar135 >= (short)uVar60) * uVar60;
            uVar107 = ((short)uVar137 < (short)uVar70) * uVar137 |
                      ((short)uVar137 >= (short)uVar70) * uVar70;
            uVar110 = ((short)uVar139 < (short)uVar75) * uVar139 |
                      ((short)uVar139 >= (short)uVar75) * uVar75;
            uVar112 = ((short)uVar140 < (short)uVar81) * uVar140 |
                      ((short)uVar140 >= (short)uVar81) * uVar81;
            uVar114 = ((short)uVar141 < (short)uVar87) * uVar141 |
                      ((short)uVar141 >= (short)uVar87) * uVar87;
            uVar116 = ((short)uVar142 < (short)uVar92) * uVar142 |
                      ((short)uVar142 >= (short)uVar92) * uVar92;
            uVar118 = ((short)uVar143 < (short)uVar97) * uVar143 |
                      ((short)uVar143 >= (short)uVar97) * uVar97;
            uVar102 = ((short)uVar120 < (short)uVar102) * uVar120 |
                      ((short)uVar120 >= (short)uVar102) * uVar102;
            uVar107 = ((short)uVar122 < (short)uVar107) * uVar122 |
                      ((short)uVar122 >= (short)uVar107) * uVar107;
            uVar110 = ((short)uVar124 < (short)uVar110) * uVar124 |
                      ((short)uVar124 >= (short)uVar110) * uVar110;
            uVar112 = ((short)uVar127 < (short)uVar112) * uVar127 |
                      ((short)uVar127 >= (short)uVar112) * uVar112;
            uVar114 = ((short)uVar129 < (short)uVar114) * uVar129 |
                      ((short)uVar129 >= (short)uVar114) * uVar114;
            uVar116 = ((short)uVar131 < (short)uVar116) * uVar131 |
                      ((short)uVar131 >= (short)uVar116) * uVar116;
            uVar118 = ((short)uVar133 < (short)uVar118) * uVar133 |
                      ((short)uVar133 >= (short)uVar118) * uVar118;
            auVar56._0_2_ = -(ushort)(uVar60 == uVar102);
            auVar56._2_2_ = -(ushort)(uVar70 == uVar107);
            auVar56._4_2_ = -(ushort)(uVar75 == uVar110);
            auVar56._6_2_ = 0;
            auVar56._8_2_ = -(ushort)(uVar81 == uVar112);
            auVar56._10_2_ = -(ushort)(uVar87 == uVar114);
            auVar56._12_2_ = -(ushort)(uVar92 == uVar116);
            auVar56._14_2_ = -(ushort)(uVar97 == uVar118);
            auVar63._0_2_ = -(ushort)(uVar102 == uVar135);
            auVar63._2_2_ = -(ushort)(uVar107 == uVar137);
            auVar63._4_2_ = -(ushort)(uVar110 == uVar139);
            auVar63._6_2_ = 0;
            auVar63._8_2_ = -(ushort)(uVar112 == uVar140);
            auVar63._10_2_ = -(ushort)(uVar114 == uVar141);
            auVar63._12_2_ = -(ushort)(uVar116 == uVar142);
            auVar66._14_2_ = -(ushort)(uVar118 == uVar143);
            auVar66._0_14_ = auVar63;
            auVar15._14_2_ = 0;
            auVar15._0_14_ = auVar63;
            auVar65 = ~auVar56 &
                      (~auVar66 & auVar65 | ZEXT516(CONCAT32(uVar14,(ushort)(byte)uVar11)) & auVar15
                      ) | auVar46 & auVar56;
            cVar58 = auVar65[0] + (char)uVar12;
            sVar119 = CONCAT11(auVar65[1],cVar58);
            cVar67 = auVar65[2] + (char)((uint3)uVar12 >> 8);
            uVar54 = CONCAT13(auVar65[3],CONCAT12(cVar67,sVar119));
            cVar68 = auVar65[4] + (char)((uint3)uVar12 >> 0x10);
            sVar115 = (short)((uint)uVar54 >> 0x10);
            sVar117 = (short)(CONCAT15(auVar65[5],CONCAT14(cVar68,uVar54)) >> 0x20);
            uVar33 = (uint)CONCAT12((0 < sVar117) * (sVar117 < 0x100) * cVar68 - (0xff < sVar117),
                                    CONCAT11((0 < sVar115) * (sVar115 < 0x100) * cVar67 -
                                             (0xff < sVar115),
                                             (0 < sVar119) * (sVar119 < 0x100) * cVar58 -
                                             (0xff < sVar119)));
            goto LAB_0010296c;
          }
        }
      }
      else if (ctx->bytes_per_pixel == 4) {
        if (uVar5 == '\x04') {
          lVar27 = 0;
          auVar55 = (undefined1  [16])0x0;
          auVar65 = (undefined1  [16])0x0;
          for (uVar30 = sVar26 + 3; 4 < uVar30; uVar30 = uVar30 - 4) {
            uVar54 = *(undefined4 *)(pbVar39 + lVar27);
            bVar45 = (byte)((uint)uVar54 >> 0x18);
            uVar13 = CONCAT25((short)(((uint7)bVar45 << 0x30) >> 0x28),
                              CONCAT14((char)((uint)uVar54 >> 0x10),uVar54));
            uVar60 = (ushort)uVar54;
            uVar38 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar13 >> 0x20),uVar54) >> 0x18),
                                     CONCAT12((char)((uint)uVar54 >> 8),uVar60)) &
                     0xffffffff00ffffff;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = CONCAT62((int6)(uVar38 >> 0x10),uVar60) & 0xffffffffffff00ff;
            uVar54 = *(undefined4 *)(pbVar44 + lVar27);
            sVar106 = (uVar60 & 0xff) - auVar65._0_2_;
            sVar109 = (short)(uVar38 >> 0x10) - auVar65._2_2_;
            sVar111 = (short)((uint7)uVar13 >> 0x20) - auVar65._4_2_;
            sVar113 = (ushort)bVar45 - auVar65._6_2_;
            sVar69 = auVar65._8_2_;
            sVar115 = -sVar69;
            sVar74 = auVar65._10_2_;
            sVar117 = -sVar74;
            sVar80 = auVar65._12_2_;
            sVar119 = -sVar80;
            sVar86 = auVar65._14_2_;
            sVar121 = -sVar86;
            sVar123 = auVar55._0_2_ - auVar65._0_2_;
            sVar126 = auVar55._2_2_ - auVar65._2_2_;
            sVar128 = auVar55._4_2_ - auVar65._4_2_;
            sVar130 = auVar55._6_2_ - auVar65._6_2_;
            sVar132 = auVar55._8_2_ - sVar69;
            sVar134 = auVar55._10_2_ - sVar74;
            sVar136 = auVar55._12_2_ - sVar80;
            sVar138 = auVar55._14_2_ - sVar86;
            sVar51 = -sVar106;
            sVar52 = -sVar109;
            sVar53 = -sVar111;
            sVar59 = -sVar113;
            uVar60 = (ushort)(sVar51 < sVar106) * sVar106 | (ushort)(sVar51 >= sVar106) * sVar51;
            uVar70 = (ushort)(sVar52 < sVar109) * sVar109 | (ushort)(sVar52 >= sVar109) * sVar52;
            uVar75 = (ushort)(sVar53 < sVar111) * sVar111 | (ushort)(sVar53 >= sVar111) * sVar53;
            uVar81 = (ushort)(sVar59 < sVar113) * sVar113 | (ushort)(sVar59 >= sVar113) * sVar59;
            uVar87 = (ushort)(sVar69 < sVar115) * sVar115 | (ushort)(sVar69 >= sVar115) * sVar69;
            uVar92 = (ushort)(sVar74 < sVar117) * sVar117 | (ushort)(sVar74 >= sVar117) * sVar74;
            uVar97 = (ushort)(sVar80 < sVar119) * sVar119 | (ushort)(sVar80 >= sVar119) * sVar80;
            uVar102 = (ushort)(sVar86 < sVar121) * sVar121 | (ushort)(sVar86 >= sVar121) * sVar86;
            sVar106 = sVar106 + sVar123;
            sVar109 = sVar109 + sVar126;
            sVar111 = sVar111 + sVar128;
            sVar113 = sVar113 + sVar130;
            sVar115 = sVar115 + sVar132;
            sVar117 = sVar117 + sVar134;
            sVar119 = sVar119 + sVar136;
            sVar121 = sVar121 + sVar138;
            sVar51 = -sVar123;
            sVar52 = -sVar126;
            sVar53 = -sVar128;
            sVar59 = -sVar130;
            sVar69 = -sVar132;
            sVar74 = -sVar134;
            sVar80 = -sVar136;
            sVar86 = -sVar138;
            uVar140 = (ushort)(sVar51 < sVar123) * sVar123 | (ushort)(sVar51 >= sVar123) * sVar51;
            uVar141 = (ushort)(sVar52 < sVar126) * sVar126 | (ushort)(sVar52 >= sVar126) * sVar52;
            uVar142 = (ushort)(sVar53 < sVar128) * sVar128 | (ushort)(sVar53 >= sVar128) * sVar53;
            uVar143 = (ushort)(sVar59 < sVar130) * sVar130 | (ushort)(sVar59 >= sVar130) * sVar59;
            uVar144 = (ushort)(sVar69 < sVar132) * sVar132 | (ushort)(sVar69 >= sVar132) * sVar69;
            uVar145 = (ushort)(sVar74 < sVar134) * sVar134 | (ushort)(sVar74 >= sVar134) * sVar74;
            uVar146 = (ushort)(sVar80 < sVar136) * sVar136 | (ushort)(sVar80 >= sVar136) * sVar80;
            uVar147 = (ushort)(sVar86 < sVar138) * sVar138 | (ushort)(sVar86 >= sVar138) * sVar86;
            sVar51 = -sVar106;
            sVar52 = -sVar109;
            sVar53 = -sVar111;
            sVar59 = -sVar113;
            sVar69 = -sVar115;
            sVar74 = -sVar117;
            sVar80 = -sVar119;
            sVar86 = -sVar121;
            uVar124 = (ushort)(sVar51 < sVar106) * sVar106 | (ushort)(sVar51 >= sVar106) * sVar51;
            uVar127 = (ushort)(sVar52 < sVar109) * sVar109 | (ushort)(sVar52 >= sVar109) * sVar52;
            uVar129 = (ushort)(sVar53 < sVar111) * sVar111 | (ushort)(sVar53 >= sVar111) * sVar53;
            uVar131 = (ushort)(sVar59 < sVar113) * sVar113 | (ushort)(sVar59 >= sVar113) * sVar59;
            uVar133 = (ushort)(sVar69 < sVar115) * sVar115 | (ushort)(sVar69 >= sVar115) * sVar69;
            uVar135 = (ushort)(sVar74 < sVar117) * sVar117 | (ushort)(sVar74 >= sVar117) * sVar74;
            uVar137 = (ushort)(sVar80 < sVar119) * sVar119 | (ushort)(sVar80 >= sVar119) * sVar80;
            uVar139 = (ushort)(sVar86 < sVar121) * sVar121 | (ushort)(sVar86 >= sVar121) * sVar86;
            uVar107 = ((short)uVar140 < (short)uVar60) * uVar140 |
                      ((short)uVar140 >= (short)uVar60) * uVar60;
            uVar110 = ((short)uVar141 < (short)uVar70) * uVar141 |
                      ((short)uVar141 >= (short)uVar70) * uVar70;
            uVar112 = ((short)uVar142 < (short)uVar75) * uVar142 |
                      ((short)uVar142 >= (short)uVar75) * uVar75;
            uVar114 = ((short)uVar143 < (short)uVar81) * uVar143 |
                      ((short)uVar143 >= (short)uVar81) * uVar81;
            uVar116 = ((short)uVar144 < (short)uVar87) * uVar144 |
                      ((short)uVar144 >= (short)uVar87) * uVar87;
            uVar118 = ((short)uVar145 < (short)uVar92) * uVar145 |
                      ((short)uVar145 >= (short)uVar92) * uVar92;
            uVar120 = ((short)uVar146 < (short)uVar97) * uVar146 |
                      ((short)uVar146 >= (short)uVar97) * uVar97;
            uVar122 = ((short)uVar147 < (short)uVar102) * uVar147 |
                      ((short)uVar147 >= (short)uVar102) * uVar102;
            uVar107 = ((short)uVar124 < (short)uVar107) * uVar124 |
                      ((short)uVar124 >= (short)uVar107) * uVar107;
            uVar110 = ((short)uVar127 < (short)uVar110) * uVar127 |
                      ((short)uVar127 >= (short)uVar110) * uVar110;
            uVar112 = ((short)uVar129 < (short)uVar112) * uVar129 |
                      ((short)uVar129 >= (short)uVar112) * uVar112;
            uVar114 = ((short)uVar131 < (short)uVar114) * uVar131 |
                      ((short)uVar131 >= (short)uVar114) * uVar114;
            uVar116 = ((short)uVar133 < (short)uVar116) * uVar133 |
                      ((short)uVar133 >= (short)uVar116) * uVar116;
            uVar118 = ((short)uVar135 < (short)uVar118) * uVar135 |
                      ((short)uVar135 >= (short)uVar118) * uVar118;
            uVar120 = ((short)uVar137 < (short)uVar120) * uVar137 |
                      ((short)uVar137 >= (short)uVar120) * uVar120;
            uVar122 = ((short)uVar139 < (short)uVar122) * uVar139 |
                      ((short)uVar139 >= (short)uVar122) * uVar122;
            auVar64._0_2_ = -(ushort)(uVar60 == uVar107);
            auVar64._2_2_ = -(ushort)(uVar70 == uVar110);
            auVar64._4_2_ = -(ushort)(uVar75 == uVar112);
            auVar64._6_2_ = -(ushort)(uVar81 == uVar114);
            auVar64._8_2_ = -(ushort)(uVar87 == uVar116);
            auVar64._10_2_ = -(ushort)(uVar92 == uVar118);
            auVar64._12_2_ = -(ushort)(uVar97 == uVar120);
            auVar64._14_2_ = -(ushort)(uVar102 == uVar122);
            auVar108._0_2_ = -(ushort)(uVar107 == uVar140);
            auVar108._2_2_ = -(ushort)(uVar110 == uVar141);
            auVar108._4_2_ = -(ushort)(uVar112 == uVar142);
            auVar108._6_2_ = -(ushort)(uVar114 == uVar143);
            auVar108._8_2_ = -(ushort)(uVar116 == uVar144);
            auVar108._10_2_ = -(ushort)(uVar118 == uVar145);
            auVar108._12_2_ = -(ushort)(uVar120 == uVar146);
            auVar108._14_2_ = -(ushort)(uVar122 == uVar147);
            auVar65 = ~auVar64 & (~auVar108 & auVar65 | auVar50 & auVar108) | auVar55 & auVar64;
            cVar58 = auVar65[0] + (char)uVar54;
            sVar121 = CONCAT11(auVar65[1],cVar58);
            cVar67 = auVar65[2] + (char)((uint)uVar54 >> 8);
            uVar61 = CONCAT13(auVar65[3],CONCAT12(cVar67,sVar121));
            cVar68 = auVar65[4] + (char)((uint)uVar54 >> 0x10);
            uVar62 = CONCAT15(auVar65[5],CONCAT14(cVar68,uVar61));
            cVar71 = auVar65[6] + (char)((uint)uVar54 >> 0x18);
            auVar55._0_8_ = CONCAT17(auVar65[7],CONCAT16(cVar71,uVar62));
            auVar55[8] = auVar65[8];
            auVar55[9] = auVar65[9];
            auVar55[10] = auVar65[10];
            auVar55[0xb] = auVar65[0xb];
            auVar55[0xc] = auVar65[0xc];
            auVar55[0xd] = auVar65[0xd];
            auVar55[0xe] = auVar65[0xe];
            auVar55[0xf] = auVar65[0xf];
            sVar115 = (short)((uint)uVar61 >> 0x10);
            sVar117 = (short)((uint6)uVar62 >> 0x20);
            sVar119 = (short)((ulong)auVar55._0_8_ >> 0x30);
            *(uint *)(pbVar44 + lVar27) =
                 CONCAT13((0 < sVar119) * (sVar119 < 0x100) * cVar71 - (0xff < sVar119),
                          CONCAT12((0 < sVar117) * (sVar117 < 0x100) * cVar68 - (0xff < sVar117),
                                   CONCAT11((0 < sVar115) * (sVar115 < 0x100) * cVar67 -
                                            (0xff < sVar115),
                                            (0 < sVar121) * (sVar121 < 0x100) * cVar58 -
                                            (0xff < sVar121))));
            lVar27 = lVar27 + 4;
            auVar65 = auVar50;
          }
        }
        else if (uVar5 == '\x03') {
          bVar45 = 0;
          bVar47 = 0;
          bVar48 = 0;
          bVar49 = 0;
          bVar73 = 0;
          bVar77 = 0;
          bVar79 = 0;
          bVar83 = 0;
          bVar85 = 0;
          bVar89 = 0;
          bVar91 = 0;
          bVar94 = 0;
          bVar96 = 0;
          bVar99 = 0;
          bVar101 = 0;
          bVar104 = 0;
          lVar27 = 0;
          for (uVar30 = sVar26 + 3; 4 < uVar30; uVar30 = uVar30 - 4) {
            pbVar1 = pbVar39 + lVar27;
            uVar54 = *(undefined4 *)(pbVar44 + lVar27);
            cVar58 = pavgb(bVar45,*pbVar1);
            cVar67 = pavgb(bVar47,pbVar1[1]);
            cVar68 = pavgb(bVar48,pbVar1[2]);
            cVar71 = pavgb(bVar49,pbVar1[3]);
            cVar72 = pavgb(bVar73,0);
            cVar76 = pavgb(bVar77,0);
            cVar78 = pavgb(bVar79,0);
            cVar82 = pavgb(bVar83,0);
            cVar84 = pavgb(bVar85,0);
            cVar88 = pavgb(bVar89,0);
            cVar90 = pavgb(bVar91,0);
            cVar93 = pavgb(bVar94,0);
            cVar95 = pavgb(bVar96,0);
            cVar98 = pavgb(bVar99,0);
            cVar100 = pavgb(bVar101,0);
            cVar103 = pavgb(bVar104,0);
            bVar73 = cVar72 - (bVar73 & 1);
            bVar77 = cVar76 - (bVar77 & 1);
            bVar79 = cVar78 - (bVar79 & 1);
            bVar83 = cVar82 - (bVar83 & 1);
            bVar85 = cVar84 - (bVar85 & 1);
            bVar89 = cVar88 - (bVar89 & 1);
            bVar91 = cVar90 - (bVar91 & 1);
            bVar94 = cVar93 - (bVar94 & 1);
            bVar96 = cVar95 - (bVar96 & 1);
            bVar99 = cVar98 - (bVar99 & 1);
            bVar101 = cVar100 - (bVar101 & 1);
            bVar104 = cVar103 - (bVar104 & 1);
            bVar45 = (cVar58 - ((bVar45 ^ *pbVar1) & 1)) + (char)uVar54;
            bVar47 = (cVar67 - ((bVar47 ^ pbVar1[1]) & 1)) + (char)((uint)uVar54 >> 8);
            bVar48 = (cVar68 - ((bVar48 ^ pbVar1[2]) & 1)) + (char)((uint)uVar54 >> 0x10);
            bVar49 = (cVar71 - ((bVar49 ^ pbVar1[3]) & 1)) + (char)((uint)uVar54 >> 0x18);
            pbVar1 = pbVar44 + lVar27;
            *pbVar1 = bVar45;
            pbVar1[1] = bVar47;
            pbVar1[2] = bVar48;
            pbVar1[3] = bVar49;
            lVar27 = lVar27 + 4;
          }
        }
        else {
          iVar24 = 0x41;
          if (uVar5 != '\x01') goto LAB_00102f59;
          bVar45 = 0;
          bVar47 = 0;
          bVar48 = 0;
          bVar49 = 0;
          for (uVar30 = sVar26 + 3; 4 < uVar30; uVar30 = uVar30 - 4) {
            uVar54 = *(undefined4 *)pbVar44;
            bVar45 = bVar45 + (char)uVar54;
            bVar47 = bVar47 + (char)((uint)uVar54 >> 8);
            bVar48 = bVar48 + (char)((uint)uVar54 >> 0x10);
            bVar49 = bVar49 + (char)((uint)uVar54 >> 0x18);
            *pbVar44 = bVar45;
            pbVar44[1] = bVar47;
            pbVar44[2] = bVar48;
            pbVar44[3] = bVar49;
            pbVar44 = pbVar44 + 4;
          }
        }
      }
      else {
        for (uVar38 = 0; __n != uVar38; uVar38 = uVar38 + 1) {
          if (uVar38 < uVar30) {
            bVar45 = 0;
            bVar47 = 0;
          }
          else {
            bVar45 = pbVar44[uVar38 - uVar30];
            bVar47 = pbVar39[uVar38 - uVar30];
          }
          bVar48 = pbVar44[uVar38];
          if (uVar5 == '\x04') {
            uVar18 = paeth(bVar45,pbVar39[uVar38],bVar47);
            bVar48 = bVar48 + uVar18;
          }
          else if (uVar5 == '\x03') {
            bVar48 = bVar48 + (char)((uint)pbVar39[uVar38] + (uint)bVar45 >> 1);
          }
          else if (uVar5 == '\x01') {
            bVar48 = bVar48 + bVar45;
          }
          pbVar44[uVar38] = bVar48;
        }
      }
    }
  }
  __s2 = ctx->trns_px;
  bVar19 = ~(byte)(-1 << (bVar19 & 0x1f));
  uVar29 = 8 - uVar35;
  (ctx->row_info).filter = bVar32;
  pbVar44 = ctx->scanline;
  uVar30 = uVar28 * 4;
  uVar33 = 2;
  uVar36 = 0;
  uVar40 = 0;
  uVar41 = 0;
  local_58 = 0;
  uVar38 = 0;
  local_a0 = 0;
  local_a8 = 0;
  local_a4 = 0;
  uVar31 = 0;
  local_b4 = 0;
  local_b0 = 0;
  uVar25 = 0;
  puVar37 = (ushort *)out;
  local_ac = uVar29;
  local_60 = pbVar44;
LAB_00102a22:
  if (uVar30 == uVar36) goto LAB_00102ee2;
  if ((uVar6 & 0x40) != 0) {
    if (-1 < (char)uVar6) {
      memcpy(out,pbVar44,__n);
    }
    goto LAB_00102ee2;
  }
  if ((uVar6 >> 8 & 1) != 0) {
    bVar19 = (ctx->ihdr).bit_depth;
    bVar32 = ~(byte)(-1 << (bVar19 & 0x1f));
    uVar35 = 8 - bVar19;
    if (sVar7 == SPNG_FMT_GA16) {
      if (bVar19 == 0x10) {
        for (uVar38 = 0; uVar38 != uVar28; uVar38 = uVar38 + 1) {
          uVar31 = (ulong)(uint)((int)uVar38 * 4);
          *(undefined2 *)((long)out + uVar31) = *(undefined2 *)(pbVar44 + (uint)((int)uVar38 * 2));
          *(undefined2 *)((long)out + uVar31 + 2) = 0xffff;
        }
      }
      else {
        pbVar39 = pbVar44;
        uVar33 = uVar35;
        for (uVar38 = 0; uVar30 != uVar38; uVar38 = uVar38 + 4) {
          bVar45 = *pbVar39;
          uVar29 = uVar33 - bVar19;
          uVar25 = uVar29;
          if (7 < uVar29) {
            uVar25 = uVar35;
          }
          pbVar39 = pbVar39 + (7 < uVar29);
          *(ushort *)((long)out + (uVar38 & 0xffffffff)) =
               (ushort)(bVar45 >> ((byte)uVar33 & 0x1f) & bVar32);
          *(undefined2 *)((long)out + (uVar38 & 0xffffffff) + 2) = 0xffff;
          uVar33 = uVar25;
        }
      }
    }
    else if (sVar7 == SPNG_FMT_GA8) {
      pbVar39 = pbVar44;
      uVar33 = uVar35;
      for (uVar38 = 0; uVar28 * 2 != uVar38; uVar38 = uVar38 + 2) {
        bVar45 = *pbVar39;
        uVar29 = uVar33 - bVar19;
        uVar25 = uVar29;
        if (7 < uVar29) {
          uVar25 = uVar35;
        }
        pbVar39 = pbVar39 + (7 < uVar29);
        *(byte *)((long)out + (uVar38 & 0xffffffff)) = bVar45 >> ((byte)uVar33 & 0x1f) & bVar32;
        *(undefined1 *)((long)out + (ulong)((int)uVar38 + 1)) = 0xff;
        uVar33 = uVar25;
      }
    }
    else {
      pbVar39 = pbVar44;
      uVar33 = uVar35;
      for (uVar38 = 0; uVar28 != uVar38; uVar38 = uVar38 + 1) {
        bVar45 = *pbVar39;
        uVar29 = uVar33 - bVar19;
        uVar25 = uVar29;
        if (7 < uVar29) {
          uVar25 = uVar35;
        }
        pbVar39 = pbVar39 + (7 < uVar29);
        *(byte *)((long)out + uVar38) = bVar45 >> ((byte)uVar33 & 0x1f) & bVar32;
        uVar33 = uVar25;
      }
    }
LAB_00102ee2:
    if ((uVar6 & 1) != 0) {
      uVar38 = (ulong)ctx->bytes_per_pixel;
      bVar19 = (ctx->ihdr).bit_depth;
      if (sVar7 == SPNG_FMT_GA16) {
        uVar35 = (uint)bVar19;
        if (uVar35 == 0x10) {
          for (lVar43 = 0; uVar8 != (uint)lVar43; lVar43 = lVar43 + 1) {
            if (*(short *)pbVar44 == *(short *)__s2) {
              *(undefined2 *)((long)out + lVar43 * 4 + 2) = 0;
            }
            pbVar44 = pbVar44 + uVar38;
          }
        }
        else {
          uVar33 = 8 - uVar35;
          for (lVar43 = 0; uVar8 != (uint)lVar43; lVar43 = lVar43 + 1) {
            uVar29 = uVar33 - uVar35;
            uVar25 = uVar29;
            if (7 < uVar29) {
              uVar25 = 8 - uVar35;
            }
            if (*__s2 == (byte)(*pbVar44 >> ((byte)uVar33 & 0x1f) & ~(byte)(-1 << (bVar19 & 0x1f))))
            {
              *(undefined2 *)((long)out + lVar43 * 4 + 2) = 0;
            }
            pbVar44 = pbVar44 + (7 < uVar29);
            uVar33 = uVar25;
          }
        }
      }
      else if (sVar7 == SPNG_FMT_RGBA16) {
        if ((ctx->ihdr).color_type != '\0') {
          for (lVar43 = 0; uVar8 != (uint)lVar43; lVar43 = lVar43 + 1) {
            iVar24 = bcmp(pbVar44,__s2,uVar38);
            if (iVar24 == 0) {
              *(undefined2 *)((long)out + lVar43 * 8 + 6) = 0;
            }
            pbVar44 = pbVar44 + uVar38;
          }
        }
      }
      else if (sVar7 == SPNG_FMT_GA8) {
        if (bVar19 == 0x10) {
          for (lVar43 = 0; uVar8 != (uint)lVar43; lVar43 = lVar43 + 1) {
            iVar24 = bcmp(pbVar44,__s2,uVar38);
            if (iVar24 == 0) {
              *(undefined1 *)((long)out + lVar43 * 2 + 1) = 0;
            }
            pbVar44 = pbVar44 + uVar38;
          }
        }
        else {
          uVar33 = 8 - bVar19;
          uVar35 = uVar33;
          for (lVar43 = 0; uVar8 != (uint)lVar43; lVar43 = lVar43 + 1) {
            bVar32 = *pbVar44;
            uVar29 = uVar35 - bVar19;
            uVar25 = uVar29;
            if (7 < uVar29) {
              uVar25 = uVar33;
            }
            pbVar44 = pbVar44 + (7 < uVar29);
            if (*__s2 == (byte)(bVar32 >> ((byte)uVar35 & 0x1f) & ~(byte)(-1 << (bVar19 & 0x1f)))) {
              *(undefined1 *)((long)out + lVar43 * 2 + 1) = 0;
            }
            uVar35 = uVar25;
          }
        }
      }
      else if ((sVar7 == SPNG_FMT_RGBA8) && ((ctx->ihdr).color_type != '\0')) {
        for (lVar43 = 0; uVar8 != (uint)lVar43; lVar43 = lVar43 + 1) {
          iVar24 = bcmp(pbVar44,__s2,uVar38);
          if (iVar24 == 0) {
            *(undefined1 *)((long)out + lVar43 * 4 + 3) = 0;
          }
          pbVar44 = pbVar44 + uVar38;
        }
      }
    }
    if ((uVar6 & 0x10) != 0) {
      if (sVar7 == SPNG_FMT_RGBA8) {
        for (uVar38 = 0; uVar30 != uVar38; uVar38 = uVar38 + 4) {
          uVar31 = uVar38 & 0xffffffff;
          bVar19 = *(byte *)((long)out + uVar31 + 1);
          bVar32 = *(byte *)((long)out + uVar31 + 2);
          bVar45 = *(byte *)((long)out + uVar31 + 3);
          uVar20 = sample_to_target((ushort)*(byte *)((long)out + uVar31),bit_depth,
                                    (uint)(ctx->decode_sb).red_bits,8);
          uVar22 = sample_to_target((ushort)bVar19,bit_depth,(uint)(ctx->decode_sb).green_bits,8);
          uVar23 = sample_to_target((ushort)bVar32,bit_depth,(uint)(ctx->decode_sb).blue_bits,8);
          uVar21 = sample_to_target((ushort)bVar45,bit_depth,(uint)(ctx->decode_sb).alpha_bits,8);
          *(char *)((long)out + uVar31) = (char)uVar20;
          *(char *)((long)out + uVar31 + 1) = (char)uVar22;
          *(char *)((long)out + uVar31 + 2) = (char)uVar23;
          *(char *)((long)out + uVar31 + 3) = (char)uVar21;
        }
      }
      else if (sVar7 == SPNG_FMT_RGBA16) {
        for (uVar38 = 0; uVar28 * 8 != uVar38; uVar38 = uVar38 + 8) {
          uVar31 = uVar38 & 0xffffffff;
          uVar20 = *(uint16_t *)((long)out + uVar31 + 2);
          uVar22 = *(uint16_t *)((long)out + uVar31 + 4);
          uVar23 = *(uint16_t *)((long)out + uVar31 + 6);
          uVar21 = sample_to_target(*(uint16_t *)((long)out + uVar31),bit_depth,
                                    (uint)(ctx->decode_sb).red_bits,0x10);
          uVar20 = sample_to_target(uVar20,bit_depth,(uint)(ctx->decode_sb).green_bits,0x10);
          uVar22 = sample_to_target(uVar22,bit_depth,(uint)(ctx->decode_sb).blue_bits,0x10);
          uVar23 = sample_to_target(uVar23,bit_depth,(uint)(ctx->decode_sb).alpha_bits,0x10);
          *(uint16_t *)((long)out + uVar31) = uVar21;
          *(uint16_t *)((long)out + uVar31 + 2) = uVar20;
          *(uint16_t *)((long)out + uVar31 + 4) = uVar22;
          *(uint16_t *)((long)out + uVar31 + 6) = uVar23;
        }
      }
      else if (sVar7 == SPNG_FMT_RGB8) {
        for (uVar38 = 0; uVar28 * 3 != uVar38; uVar38 = uVar38 + 3) {
          uVar31 = uVar38 & 0xffffffff;
          bVar19 = *(byte *)((long)out + uVar31 + 1);
          bVar32 = *(byte *)((long)out + uVar31 + 2);
          uVar20 = sample_to_target((ushort)*(byte *)((long)out + uVar31),bit_depth,
                                    (uint)(ctx->decode_sb).red_bits,8);
          uVar22 = sample_to_target((ushort)bVar19,bit_depth,(uint)(ctx->decode_sb).green_bits,8);
          uVar23 = sample_to_target((ushort)bVar32,bit_depth,(uint)(ctx->decode_sb).blue_bits,8);
          *(char *)((long)out + uVar31) = (char)uVar20;
          *(char *)((long)out + uVar31 + 1) = (char)uVar22;
          *(char *)((long)out + uVar31 + 2) = (char)uVar23;
        }
      }
      else if (sVar7 == SPNG_FMT_G8) {
        for (uVar38 = 0; uVar28 != uVar38; uVar38 = uVar38 + 1) {
          uVar20 = sample_to_target((ushort)*(byte *)((long)out + uVar38),bit_depth,
                                    (uint)(ctx->decode_sb).grayscale_bits,8);
          *(char *)((long)out + uVar38) = (char)uVar20;
        }
      }
      else if (sVar7 == SPNG_FMT_GA8) {
        for (uVar38 = 0; uVar28 * 2 != uVar38; uVar38 = uVar38 + 2) {
          uVar20 = sample_to_target((ushort)*(byte *)((long)out + (uVar38 & 0xffffffff)),bit_depth,
                                    (uint)(ctx->decode_sb).grayscale_bits,8);
          *(char *)((long)out + (uVar38 & 0xffffffff)) = (char)uVar20;
        }
      }
    }
    if ((uVar6 & 2) != 0) {
      if (sVar7 == SPNG_FMT_RGBA8) {
        for (uVar28 = 0; uVar30 != uVar28; uVar28 = uVar28 + 4) {
          uVar38 = uVar28 & 0xffffffff;
          *(char *)((long)out + uVar38) = (char)puVar10[*(byte *)((long)out + uVar38)];
          *(char *)((long)out + uVar38 + 1) = (char)puVar10[*(byte *)((long)out + uVar38 + 1)];
          *(char *)((long)out + uVar38 + 2) = (char)puVar10[*(byte *)((long)out + uVar38 + 2)];
        }
      }
      else if (sVar7 == SPNG_FMT_RGBA16) {
        for (uVar30 = 0; uVar28 << 3 != uVar30; uVar30 = uVar30 + 8) {
          uVar38 = uVar30 & 0xffffffff;
          uVar20 = puVar10[*(ushort *)((long)out + uVar38 + 2)];
          uVar22 = puVar10[*(ushort *)((long)out + uVar38 + 4)];
          *(uint16_t *)((long)out + uVar38) = puVar10[*(ushort *)((long)out + uVar38)];
          *(uint16_t *)((long)out + uVar38 + 2) = uVar20;
          *(uint16_t *)((long)out + uVar38 + 4) = uVar22;
        }
      }
      else if (sVar7 == SPNG_FMT_RGB8) {
        for (uVar30 = 0; uVar28 * 3 != uVar30; uVar30 = uVar30 + 3) {
          uVar38 = uVar30 & 0xffffffff;
          *(char *)((long)out + uVar38) = (char)puVar10[*(byte *)((long)out + uVar38)];
          *(char *)((long)out + uVar38 + 1) = (char)puVar10[*(byte *)((long)out + uVar38 + 1)];
          *(char *)((long)out + uVar38 + 2) = (char)puVar10[*(byte *)((long)out + uVar38 + 2)];
        }
      }
    }
    uVar3 = ctx->scanline;
    uVar4 = ctx->prev_scanline;
    auVar65._8_4_ = (int)uVar3;
    auVar65._0_8_ = uVar4;
    auVar65._12_4_ = (int)((ulong)uVar3 >> 0x20);
    ctx->scanline = (uchar *)uVar4;
    ctx->prev_scanline = (uchar *)auVar65._8_8_;
    iVar24 = update_row_info(ctx);
    if (iVar24 != 0x4b) {
      return iVar24;
    }
    if ((ctx->cur_chunk_bytes_left == 0) ||
       (iVar24 = discard_chunk_bytes(ctx,ctx->cur_chunk_bytes_left), iVar24 == 0)) {
      uVar54 = *(undefined4 *)&(ctx->current_chunk).field_0x14;
      (ctx->last_idat).crc = (ctx->current_chunk).crc;
      *(undefined4 *)&(ctx->last_idat).field_0x14 = uVar54;
      uVar9 = (ctx->current_chunk).length;
      uVar5 = (ctx->current_chunk).type[0];
      uVar18 = (ctx->current_chunk).type[1];
      uVar16 = (ctx->current_chunk).type[2];
      uVar17 = (ctx->current_chunk).type[3];
      (ctx->last_idat).offset = (ctx->current_chunk).offset;
      (ctx->last_idat).length = uVar9;
      (ctx->last_idat).type[0] = uVar5;
      (ctx->last_idat).type[1] = uVar18;
      (ctx->last_idat).type[2] = uVar16;
      (ctx->last_idat).type[3] = uVar17;
      return 0x4b;
    }
    goto LAB_00102f59;
  }
  iVar24 = (int)uVar36;
  bVar32 = (byte)local_ac;
  switch((ctx->ihdr).color_type) {
  case '\0':
    if ((ctx->ihdr).bit_depth == '\x10') {
      uVar60 = *(ushort *)(pbVar44 + uVar40);
      local_a4 = (uint)uVar60;
      if (((uVar6 & 1) == 0) || ((ctx->trns).gray != uVar60)) {
        local_b0 = 0xffff;
      }
      else {
        local_b0 = 0;
      }
      uVar31 = (ulong)local_a4;
      local_b4 = (uint)uVar60;
    }
    else {
      bVar45 = *local_78;
      uVar25 = local_ac - uVar35;
      local_ac = uVar25;
      if (7 < uVar25) {
        local_ac = uVar29;
      }
      local_78 = local_78 + (7 < uVar25);
      bVar32 = bVar45 >> (bVar32 & 0x1f) & bVar19;
      uVar25 = (uint)bVar32;
      uVar38 = (ulong)uVar25;
      if (((uVar6 & 1) == 0) || ((ctx->trns).gray != (ushort)bVar32)) {
        local_a8 = 0xff;
      }
      else {
        local_a8 = 0;
      }
      local_a0 = (ulong)uVar25;
    }
    goto LAB_00102d04;
  case '\x02':
    if ((ctx->ihdr).bit_depth == '\x10') {
      uVar31 = local_58 & 0xffffffff;
      uVar75 = *(ushort *)(pbVar44 + uVar31);
      uVar70 = *(ushort *)(pbVar44 + uVar31 + 2);
      uVar60 = *(ushort *)(pbVar44 + uVar31 + 4);
      local_b0 = 0xffff;
LAB_00102b87:
      local_a4 = (uint)uVar75;
      local_b4 = (uint)uVar60;
      uVar31 = (ulong)uVar70;
      break;
    }
    if (sVar7 == SPNG_FMT_RGBA8) {
      uVar35 = 3;
      for (uVar38 = 0; uVar28 * 3 != uVar38; uVar38 = uVar38 + 3) {
        *(byte *)((long)out + (ulong)(uVar35 - 3) + 2) = pbVar44[(uVar38 & 0xffffffff) + 2];
        *(undefined2 *)((long)out + (ulong)(uVar35 - 3)) =
             *(undefined2 *)(pbVar44 + (uVar38 & 0xffffffff));
        *(undefined1 *)((long)out + (ulong)uVar35) = 0xff;
        uVar35 = uVar35 + 4;
      }
      goto LAB_00102ee2;
    }
    uVar25 = (uint)pbVar44[uVar33 - 2];
    uVar38 = (ulong)pbVar44[uVar33 - 1];
    local_a0 = CONCAT71(0x10b0,pbVar44[uVar33]);
    local_a8 = 0xff;
    goto LAB_00102d04;
  case '\x03':
    if ((ctx->ihdr).bit_depth != '\b') {
      bVar45 = *local_78;
      uVar34 = local_ac - uVar35;
      local_ac = uVar34;
      if (7 < uVar34) {
        local_ac = uVar29;
      }
      local_78 = local_78 + (7 < uVar34);
      uVar42 = (ulong)(bVar45 >> (bVar32 & 0x1f) & bVar19);
      if ((sVar7 & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) goto LAB_00102e1b;
      *(uchar *)puVar37 = ctx->trns_px[uVar42 * 4 + 8];
      *(uchar *)((long)puVar37 + 1) = ctx->trns_px[uVar42 * 4 + 9];
      *(uchar *)(puVar37 + 1) = ctx->trns_px[uVar42 * 4 + 10];
      if (sVar7 == SPNG_FMT_RGBA8) {
        *(uchar *)((long)puVar37 + 3) = ctx->trns_px[uVar42 * 4 + 0xb];
      }
      goto LAB_00102ea5;
    }
    if ((sVar7 & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) != 0) {
      if (sVar7 == SPNG_FMT_RGBA8) {
        pbVar39 = pbVar44;
        for (uVar38 = 0; uVar30 != uVar38; uVar38 = uVar38 + 4) {
          uVar31 = uVar38 & 0xffffffff;
          uVar36 = (ulong)*pbVar39;
          *(uchar *)((long)out + uVar31) = ctx->trns_px[uVar36 * 4 + 8];
          *(uchar *)((long)out + uVar31 + 1) = ctx->trns_px[uVar36 * 4 + 9];
          *(uchar *)((long)out + uVar31 + 2) = ctx->trns_px[uVar36 * 4 + 10];
          *(uchar *)((long)out + uVar31 + 3) = ctx->trns_px[uVar36 * 4 + 0xb];
          pbVar39 = pbVar39 + 1;
        }
      }
      else if (sVar7 == SPNG_FMT_RGB8) {
        pbVar39 = pbVar44;
        for (uVar38 = 0; uVar28 * 3 != uVar38; uVar38 = uVar38 + 3) {
          uVar31 = uVar38 & 0xffffffff;
          uVar36 = (ulong)*pbVar39;
          *(uchar *)((long)out + uVar31) = ctx->trns_px[uVar36 * 4 + 8];
          *(uchar *)((long)out + uVar31 + 1) = ctx->trns_px[uVar36 * 4 + 9];
          *(uchar *)((long)out + uVar31 + 2) = ctx->trns_px[uVar36 * 4 + 10];
          pbVar39 = pbVar39 + 1;
        }
      }
      goto LAB_00102ee2;
    }
    uVar42 = (ulong)*local_60;
LAB_00102e1b:
    uVar60 = CONCAT11(ctx->trns_px[uVar42 * 4 + 8],ctx->trns_px[uVar42 * 4 + 8]);
    local_a4 = (uint)uVar60;
    uVar70 = CONCAT11(ctx->trns_px[uVar42 * 4 + 9],ctx->trns_px[uVar42 * 4 + 9]);
    uVar31 = (ulong)uVar70;
    uVar75 = CONCAT11(ctx->trns_px[uVar42 * 4 + 10],ctx->trns_px[uVar42 * 4 + 10]);
    local_b4 = (uint)uVar75;
    uVar81 = CONCAT11(ctx->trns_px[uVar42 * 4 + 0xb],ctx->trns_px[uVar42 * 4 + 0xb]);
    local_b0 = (uint)uVar81;
    *puVar37 = uVar60;
    puVar37[1] = uVar70;
    puVar37[2] = uVar75;
    puVar37[3] = uVar81;
    goto LAB_00102ea5;
  case '\x04':
    if ((ctx->ihdr).bit_depth == '\x10') {
      uVar60 = *(ushort *)(pbVar44 + (uVar36 & 0xffffffff));
      uVar31 = (ulong)uVar60;
      local_b0 = (uint)*(ushort *)(pbVar44 + (uVar36 & 0xffffffff) + 2);
      local_a4 = (uint)uVar60;
      local_b4 = (uint)uVar60;
    }
    else {
      uVar25 = (uint)pbVar44[uVar40];
      uVar38 = (ulong)uVar25;
      local_a8 = (uint)pbVar44[uVar40 + 1];
      local_a0 = (ulong)uVar25;
    }
    break;
  case '\x06':
    if ((ctx->ihdr).bit_depth == '\x10') {
      uVar31 = uVar41 & 0xffffffff;
      uVar75 = *(ushort *)(pbVar44 + uVar31);
      uVar70 = *(ushort *)(pbVar44 + uVar31 + 2);
      uVar60 = *(ushort *)(pbVar44 + uVar31 + 4);
      local_b0 = (uint)*(ushort *)(pbVar44 + uVar31 + 6);
      goto LAB_00102b87;
    }
    uVar25 = (uint)pbVar44[uVar36 & 0xffffffff];
    uVar38 = (ulong)pbVar44[iVar24 + 1];
    local_a0 = (ulong)pbVar44[iVar24 + 2];
    local_a8 = (uint)pbVar44[iVar24 + 3];
  }
LAB_00102d04:
  if ((sVar7 & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) {
    if (sVar7 == SPNG_FMT_RGBA16) {
      if ((ctx->ihdr).bit_depth != '\x10') {
        local_b4 = (uint)(byte)local_a0;
        local_b0 = local_a8;
        uVar31 = uVar38;
        local_a4 = uVar25;
      }
      *puVar37 = (ushort)local_a4;
      puVar37[1] = (ushort)uVar31;
      puVar37[2] = (ushort)local_b4;
      puVar37[3] = (ushort)local_b0;
    }
  }
  else {
    if ((ctx->ihdr).bit_depth == '\x10') {
      uVar25 = local_a4 >> 8;
      uVar38 = uVar31 >> 8;
      local_a0 = (ulong)(local_b4 >> 8);
      local_a8 = local_b0 >> 8;
    }
    *(char *)puVar37 = (char)uVar25;
    *(char *)((long)puVar37 + 1) = (char)uVar38;
    *(char *)(puVar37 + 1) = (char)local_a0;
    if (sVar7 == SPNG_FMT_RGBA8) {
      *(char *)((long)puVar37 + 3) = (char)local_a8;
    }
  }
LAB_00102ea5:
  local_58 = local_58 + 6;
  uVar41 = uVar41 + 8;
  uVar40 = uVar40 + 2;
  uVar36 = uVar36 + 4;
  uVar33 = uVar33 + 3;
  local_60 = local_60 + 1;
  puVar37 = (ushort *)((long)puVar37 + lVar43);
  goto LAB_00102a22;
}

Assistant:

int spng_decode_scanline(spng_ctx *ctx, void *out, size_t len)
{
    if(ctx == NULL || out == NULL) return 1;

    if(ctx->state >= SPNG_STATE_EOI) return SPNG_EOI;

    struct decode_flags f = ctx->decode_flags;

    struct spng_row_info *ri = &ctx->row_info;
    const struct spng_subimage *sub = ctx->subimage;

    const struct spng_ihdr *ihdr = &ctx->ihdr;
    const uint16_t *gamma_lut = ctx->gamma_lut;
    unsigned char *trns_px = ctx->trns_px;
    const struct spng_sbit *sb = &ctx->decode_sb;
    const struct spng_plte_entry *plte = ctx->decode_plte.rgba;
    struct spng__iter iter = spng__iter_init(ihdr->bit_depth, ctx->scanline);

    const unsigned char *scanline;

    const int pass = ri->pass;
    const int fmt = ctx->fmt;
    const size_t scanline_width = sub[pass].scanline_width;
    const uint32_t width = sub[pass].width;
    uint32_t k;
    uint8_t r_8, g_8, b_8, a_8, gray_8;
    uint16_t r_16, g_16, b_16, a_16, gray_16;
    r_8=0; g_8=0; b_8=0; a_8=0; gray_8=0;
    r_16=0; g_16=0; b_16=0; a_16=0; gray_16=0;
    size_t pixel_size = 4; /* SPNG_FMT_RGBA8 */
    size_t pixel_offset = 0;
    unsigned char *pixel;
    unsigned processing_depth = ihdr->bit_depth;

    if(f.indexed) processing_depth = 8;

    if(fmt == SPNG_FMT_RGBA16) pixel_size = 8;
    else if(fmt == SPNG_FMT_RGB8) pixel_size = 3;

    if(len < sub[pass].out_width) return SPNG_EBUFSIZ;

    int ret = read_scanline(ctx);

    if(ret) return decode_err(ctx, ret);

    scanline = ctx->scanline;

    for(k=0; k < width; k++)
    {
        pixel = (unsigned char*)out + pixel_offset;
        pixel_offset += pixel_size;

        if(f.same_layout)
        {
            if(f.zerocopy) break;

            memcpy(out, scanline, scanline_width - 1);
            break;
        }

        if(f.unpack)
        {
            unpack_scanline(out, scanline, width, ihdr->bit_depth, fmt);
            break;
        }

        if(ihdr->color_type == SPNG_COLOR_TYPE_TRUECOLOR)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&r_16, scanline + (k * 6), 2);
                memcpy(&g_16, scanline + (k * 6) + 2, 2);
                memcpy(&b_16, scanline + (k * 6) + 4, 2);

                a_16 = 65535;
            }
            else /* == 8 */
            {
                if(fmt == SPNG_FMT_RGBA8)
                {
                    rgb8_row_to_rgba8(scanline, out, width);
                    break;
                }

                r_8 = scanline[k * 3];
                g_8 = scanline[k * 3 + 1];
                b_8 = scanline[k * 3 + 2];

                a_8 = 255;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_INDEXED)
        {
            uint8_t entry = 0;

            if(ihdr->bit_depth == 8)
            {
                if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
                {
                    expand_row(out, scanline, &ctx->decode_plte, width, fmt);
                    break;
                }

                entry = scanline[k];
            }
            else /* < 8 */
            {
                entry = get_sample(&iter);
            }

            if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
            {
                pixel[0] = plte[entry].red;
                pixel[1] = plte[entry].green;
                pixel[2] = plte[entry].blue;
                if(fmt == SPNG_FMT_RGBA8) pixel[3] = plte[entry].alpha;

                continue;
            }
            else /* RGBA16 */
            {
                r_16 = plte[entry].red;
                g_16 = plte[entry].green;
                b_16 = plte[entry].blue;
                a_16 = plte[entry].alpha;

                r_16 = (r_16 << 8) | r_16;
                g_16 = (g_16 << 8) | g_16;
                b_16 = (b_16 << 8) | b_16;
                a_16 = (a_16 << 8) | a_16;

                memcpy(pixel, &r_16, 2);
                memcpy(pixel + 2, &g_16, 2);
                memcpy(pixel + 4, &b_16, 2);
                memcpy(pixel + 6, &a_16, 2);

                continue;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_TRUECOLOR_ALPHA)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&r_16, scanline + (k * 8), 2);
                memcpy(&g_16, scanline + (k * 8) + 2, 2);
                memcpy(&b_16, scanline + (k * 8) + 4, 2);
                memcpy(&a_16, scanline + (k * 8) + 6, 2);
            }
            else /* == 8 */
            {
                r_8 = scanline[k * 4];
                g_8 = scanline[k * 4 + 1];
                b_8 = scanline[k * 4 + 2];
                a_8 = scanline[k * 4 + 3];
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_GRAYSCALE)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&gray_16, scanline + k * 2, 2);

                if(f.apply_trns && ctx->trns.gray == gray_16) a_16 = 0;
                else a_16 = 65535;

                r_16 = gray_16;
                g_16 = gray_16;
                b_16 = gray_16;
            }
            else /* <= 8 */
            {
                gray_8 = get_sample(&iter);

                if(f.apply_trns && ctx->trns.gray == gray_8) a_8 = 0;
                else a_8 = 255;

                r_8 = gray_8; g_8 = gray_8; b_8 = gray_8;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_GRAYSCALE_ALPHA)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&gray_16, scanline + (k * 4), 2);
                memcpy(&a_16, scanline + (k * 4) + 2, 2);

                r_16 = gray_16;
                g_16 = gray_16;
                b_16 = gray_16;
            }
            else /* == 8 */
            {
                gray_8 = scanline[k * 2];
                a_8 = scanline[k * 2 + 1];

                r_8 = gray_8;
                g_8 = gray_8;
                b_8 = gray_8;
            }
        }


        if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
        {
            if(ihdr->bit_depth == 16)
            {
                r_8 = r_16 >> 8;
                g_8 = g_16 >> 8;
                b_8 = b_16 >> 8;
                a_8 = a_16 >> 8;
            }

            pixel[0] = r_8;
            pixel[1] = g_8;
            pixel[2] = b_8;

            if(fmt == SPNG_FMT_RGBA8) pixel[3] = a_8;
        }
        else if(fmt == SPNG_FMT_RGBA16)
        {
            if(ihdr->bit_depth != 16)
            {
                r_16 = r_8;
                g_16 = g_8;
                b_16 = b_8;
                a_16 = a_8;
            }

            memcpy(pixel, &r_16, 2);
            memcpy(pixel + 2, &g_16, 2);
            memcpy(pixel + 4, &b_16, 2);
            memcpy(pixel + 6, &a_16, 2);
        }
    }/* for(k=0; k < width; k++) */

    if(f.apply_trns) trns_row(out, scanline, trns_px, ctx->bytes_per_pixel, &ctx->ihdr, width, fmt);

    if(f.do_scaling) scale_row(out, width, fmt, processing_depth, sb);

    if(f.apply_gamma) gamma_correct_row(out, width, fmt, gamma_lut);

    /* The previous scanline is always defiltered */
    void *t = ctx->prev_scanline;
    ctx->prev_scanline = ctx->scanline;
    ctx->scanline = t;

    ret = update_row_info(ctx);

    if(ret == SPNG_EOI)
    {
        if(ctx->cur_chunk_bytes_left) /* zlib stream ended before an IDAT chunk boundary */
        {/* Discard the rest of the chunk */
            int error = discard_chunk_bytes(ctx, ctx->cur_chunk_bytes_left);
            if(error) return decode_err(ctx, error);
        }

        ctx->last_idat = ctx->current_chunk;
    }

    return ret;
}